

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListModeViewBase::updateVerticalScrollBar(QListModeViewBase *this,QSize *step)

{
  bool bVar1;
  ScrollMode SVar2;
  Flow FVar3;
  int min;
  int iVar4;
  int iVar5;
  int max;
  qsizetype qVar6;
  QCommonListViewBase *in_RDI;
  QSize *in_stack_00000008;
  QCommonListViewBase *in_stack_00000010;
  bool in_stack_0000001f;
  int pageSteps;
  int steps;
  int in_stack_00000068;
  int in_stack_0000006c;
  int in_stack_ffffffffffffffcc;
  QSize *local_28;
  int in_stack_ffffffffffffffe8;
  
  SVar2 = QCommonListViewBase::verticalScrollMode((QCommonListViewBase *)0x881411);
  if ((SVar2 != ScrollPerItem) ||
     (((FVar3 = QCommonListViewBase::flow(in_RDI), FVar3 != TopToBottom ||
       (bVar1 = QCommonListViewBase::isWrapping((QCommonListViewBase *)0x881433), bVar1)) &&
      ((FVar3 = QCommonListViewBase::flow(in_RDI), FVar3 != LeftToRight ||
       (bVar1 = QCommonListViewBase::isWrapping((QCommonListViewBase *)0x881456), !bVar1)))))) {
    QCommonListViewBase::updateVerticalScrollBar(in_stack_00000010,in_stack_00000008);
  }
  else {
    FVar3 = QCommonListViewBase::flow(in_RDI);
    if (FVar3 == TopToBottom) {
      local_28 = (QSize *)&in_RDI[3].qq;
    }
    else {
      local_28 = &in_RDI[1].contentsSize;
    }
    qVar6 = QList<int>::size((QList<int> *)local_28);
    min = (int)qVar6 + -1;
    if (min < 1) {
      QCommonListViewBase::verticalScrollBar((QCommonListViewBase *)0x88154e);
      QAbstractSlider::setRange((QAbstractSlider *)in_RDI,min,in_stack_ffffffffffffffe8);
    }
    else {
      QCommonListViewBase::viewport(in_RDI);
      iVar4 = QWidget::height((QWidget *)0x8814bd);
      iVar5 = QSize::height((QSize *)0x8814cf);
      QCommonListViewBase::isWrapping((QCommonListViewBase *)0x8814dd);
      max = perItemScrollingPageSteps
                      (_pageSteps,in_stack_0000006c,in_stack_00000068,in_stack_0000001f);
      QCommonListViewBase::verticalScrollBar((QCommonListViewBase *)0x881503);
      QAbstractSlider::setSingleStep
                ((QAbstractSlider *)CONCAT44(iVar5,iVar4),in_stack_ffffffffffffffcc);
      QCommonListViewBase::verticalScrollBar((QCommonListViewBase *)0x88151a);
      QAbstractSlider::setPageStep
                ((QAbstractSlider *)CONCAT44(iVar5,iVar4),in_stack_ffffffffffffffcc);
      QCommonListViewBase::verticalScrollBar((QCommonListViewBase *)0x881530);
      QAbstractSlider::setRange((QAbstractSlider *)in_RDI,min,max);
    }
  }
  return;
}

Assistant:

void QListModeViewBase::updateVerticalScrollBar(const QSize &step)
{
    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem
        && ((flow() == QListView::TopToBottom && !isWrapping())
        || (flow() == QListView::LeftToRight && isWrapping()))) {
            const int steps = (flow() == QListView::TopToBottom ? scrollValueMap : segmentPositions).size() - 1;
            if (steps > 0) {
                const int pageSteps = perItemScrollingPageSteps(viewport()->height(), contentsSize.height(), isWrapping());
                verticalScrollBar()->setSingleStep(1);
                verticalScrollBar()->setPageStep(pageSteps);
                verticalScrollBar()->setRange(0, steps - pageSteps);
            } else {
                verticalScrollBar()->setRange(0, 0);
            }
            // } else if (vertical && d->isWrapping() && d->movement == Static) {
            // ### wrapped scrolling in flow direction
    } else {
        QCommonListViewBase::updateVerticalScrollBar(step);
    }
}